

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particleSamples.cpp
# Opt level: O1

int __thiscall
particleSamples::read_in_particle_samples_SMASH_binary
          (particleSamples *this,ifstream *SMASH_inputfile,
          vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
          *resulting_particle_list)

{
  pointer *pppvVar1;
  iterator __position;
  vector<particle_info,std::allocator<particle_info>> *this_00;
  bool bVar2;
  undefined4 uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  anon_struct_120_15_f999644b *paVar7;
  iterator __position_00;
  long lVar8;
  byte bVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar12;
  char block_type;
  uint32_t n_part_lines;
  int32_t pdg;
  char empty;
  uint32_t ev;
  double time_last_coll;
  double pz;
  double py;
  double px;
  double p0;
  double m;
  double z;
  double y;
  int32_t pdg_mother2;
  int32_t pdg_mother1;
  int32_t proc_type_origin;
  int32_t proc_id_origin;
  int32_t ncoll;
  int32_t charge;
  int32_t id;
  double xsecfac;
  double form_time;
  double impact_parameter;
  char local_145;
  int local_144;
  uint local_140;
  undefined4 local_13c;
  double local_138;
  double local_130;
  particleSamples *local_128;
  ulong local_120;
  double local_118;
  double local_110;
  double local_108;
  double local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  double local_e0;
  undefined1 local_d4 [4];
  undefined1 local_d0 [4];
  undefined1 local_cc [4];
  undefined1 local_c8 [4];
  undefined1 local_c4 [4];
  undefined1 local_c0 [4];
  undefined1 local_bc [4];
  undefined1 local_b8 [8];
  undefined1 local_b0 [8];
  vector<particle_info,_std::allocator<particle_info>_> *local_a8;
  double local_a0;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double dStack_68;
  double local_60;
  double local_58;
  
  bVar9 = 0;
  clear_out_previous_record(this,resulting_particle_list);
  uVar5 = 0;
  local_144 = 0;
  local_128 = this;
  do {
    if (this->event_buffer_size <= (int)uVar5) {
      return 0;
    }
    std::istream::read((char *)SMASH_inputfile,(long)&local_145);
    bVar2 = true;
    if (((byte)SMASH_inputfile[*(long *)(*(long *)SMASH_inputfile + -0x18) + 0x20] & 5) == 0) {
      if (local_145 == 'p') {
        local_a8 = (vector<particle_info,_std::allocator<particle_info>_> *)operator_new(0x18);
        (local_a8->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (local_a8->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (local_a8->super__Vector_base<particle_info,_std::allocator<particle_info>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        __position._M_current =
             (resulting_particle_list->
             super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (resulting_particle_list->
            super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
          ::_M_realloc_insert<std::vector<particle_info,std::allocator<particle_info>>*>
                    ((vector<std::vector<particle_info,std::allocator<particle_info>>*,std::allocator<std::vector<particle_info,std::allocator<particle_info>>*>>
                      *)resulting_particle_list,__position,&local_a8);
        }
        else {
          *__position._M_current = local_a8;
          pppvVar1 = &(resulting_particle_list->
                      super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          *pppvVar1 = *pppvVar1 + 1;
        }
        std::istream::read((char *)SMASH_inputfile,(long)&local_140);
        if (local_140 != 0) {
          lVar8 = (long)local_144;
          uVar6 = 0;
          local_120 = uVar5;
          do {
            std::istream::read((char *)SMASH_inputfile,(long)&local_130);
            std::istream::read((char *)SMASH_inputfile,(long)&local_138);
            std::istream::read((char *)SMASH_inputfile,(long)&local_e0);
            std::istream::read((char *)SMASH_inputfile,(long)&local_e8);
            std::istream::read((char *)SMASH_inputfile,(long)&local_f0);
            std::istream::read((char *)SMASH_inputfile,(long)&local_f8);
            std::istream::read((char *)SMASH_inputfile,(long)&local_100);
            std::istream::read((char *)SMASH_inputfile,(long)&local_108);
            std::istream::read((char *)SMASH_inputfile,(long)&local_110);
            std::istream::read((char *)SMASH_inputfile,(long)&local_13c);
            std::istream::read((char *)SMASH_inputfile,(long)local_bc);
            std::istream::read((char *)SMASH_inputfile,(long)local_c0);
            std::istream::read((char *)SMASH_inputfile,(long)local_c4);
            std::istream::read((char *)SMASH_inputfile,(long)local_b0);
            std::istream::read((char *)SMASH_inputfile,(long)local_b8);
            std::istream::read((char *)SMASH_inputfile,(long)local_c8);
            std::istream::read((char *)SMASH_inputfile,(long)local_cc);
            std::istream::read((char *)SMASH_inputfile,(long)&local_118);
            std::istream::read((char *)SMASH_inputfile,(long)local_d0);
            std::istream::read((char *)SMASH_inputfile,(long)local_d4);
            dVar12 = local_130 - local_118;
            local_a8 = (vector<particle_info,_std::allocator<particle_info>_> *)
                       CONCAT44(local_a8._4_4_,local_13c);
            local_a0 = local_f0;
            local_58 = local_118;
            auVar10._8_8_ = local_108;
            auVar10._0_8_ = local_100;
            auVar11._8_8_ = local_f8;
            auVar11._0_8_ = local_f8;
            auVar11 = divpd(auVar10,auVar11);
            local_70 = local_138 - dVar12 * auVar11._0_8_;
            dStack_68 = local_e0 - dVar12 * auVar11._8_8_;
            local_60 = local_e8 - (local_110 / local_f8) * dVar12;
            local_78 = local_f8;
            local_90 = local_100;
            local_88 = local_108;
            local_80 = local_110;
            this_00 = (vector<particle_info,std::allocator<particle_info>> *)
                      (resulting_particle_list->
                      super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                      )._M_impl.super__Vector_impl_data._M_start[lVar8];
            __position_00._M_current = *(anon_struct_120_15_f999644b **)(this_00 + 8);
            if (__position_00._M_current == *(anon_struct_120_15_f999644b **)(this_00 + 0x10)) {
              std::vector<particle_info,std::allocator<particle_info>>::
              _M_realloc_insert<particle_info_const&>
                        (this_00,__position_00,(anon_struct_120_15_f999644b *)&local_a8);
            }
            else {
              paVar7 = (anon_struct_120_15_f999644b *)&local_a8;
              for (lVar4 = 0xf; lVar4 != 0; lVar4 = lVar4 + -1) {
                uVar3 = *(undefined4 *)&paVar7->field_0x4;
                (__position_00._M_current)->monval = paVar7->monval;
                *(undefined4 *)&(__position_00._M_current)->field_0x4 = uVar3;
                paVar7 = (anon_struct_120_15_f999644b *)((long)paVar7 + (ulong)bVar9 * -0x10 + 8);
                __position_00._M_current = __position_00._M_current + (ulong)bVar9 * -0x10 + 8;
              }
              *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x78;
            }
            uVar6 = uVar6 + 1;
            uVar5 = local_120;
            this = local_128;
          } while (uVar6 < local_140);
        }
        uVar5 = (ulong)((int)uVar5 + local_140);
        local_144 = local_144 + 1;
      }
      else {
        if (local_145 != 'f') goto LAB_001166bf;
        std::istream::read((char *)SMASH_inputfile,(long)&local_130);
        std::istream::read((char *)SMASH_inputfile,(long)&local_a8);
        if (6 < this->smash_format_version_) {
          std::istream::read((char *)SMASH_inputfile,(long)&local_138);
        }
      }
      bVar2 = false;
    }
LAB_001166bf:
    if (bVar2) {
      return 0;
    }
  } while( true );
}

Assistant:

int particleSamples::read_in_particle_samples_SMASH_binary(
    std::ifstream &SMASH_inputfile,
    std::vector<std::vector<particle_info> *> *resulting_particle_list) {
    // clean out the previous record
    clear_out_previous_record(resulting_particle_list);
    int ievent = 0, num_particles = 0;
    while (num_particles < event_buffer_size) {
        char block_type;
        SMASH_inputfile.read(&block_type, sizeof(char));
        if (!SMASH_inputfile) {
            break;
        }
        if (block_type == 'f') {
            uint32_t ev;
            double impact_parameter;
            char empty;
            SMASH_inputfile.read(
                reinterpret_cast<char *>(&ev), sizeof(std::uint32_t));
            SMASH_inputfile.read(
                reinterpret_cast<char *>(&impact_parameter), sizeof(double));
            if (smash_format_version_ > 6) {
                SMASH_inputfile.read(&empty, sizeof(char));
            }
            continue;
        }
        if (block_type != 'p') {
            break;
        }
        resulting_particle_list->push_back(new vector<particle_info>);

        uint32_t n_part_lines;
        SMASH_inputfile.read(
            reinterpret_cast<char *>(&n_part_lines), sizeof(std::uint32_t));
        for (size_t i = 0; i < n_part_lines; i++) {
            double t, x, y, z, m, p0, px, py, pz, form_time, xsecfac,
                time_last_coll;
            int32_t pdg, id, charge, ncoll, proc_id_origin, proc_type_origin,
                pdg_mother1, pdg_mother2;
            SMASH_inputfile.read(reinterpret_cast<char *>(&t), sizeof(double));
            SMASH_inputfile.read(reinterpret_cast<char *>(&x), sizeof(double));
            SMASH_inputfile.read(reinterpret_cast<char *>(&y), sizeof(double));
            SMASH_inputfile.read(reinterpret_cast<char *>(&z), sizeof(double));
            SMASH_inputfile.read(reinterpret_cast<char *>(&m), sizeof(double));
            SMASH_inputfile.read(reinterpret_cast<char *>(&p0), sizeof(double));
            SMASH_inputfile.read(reinterpret_cast<char *>(&px), sizeof(double));
            SMASH_inputfile.read(reinterpret_cast<char *>(&py), sizeof(double));
            SMASH_inputfile.read(reinterpret_cast<char *>(&pz), sizeof(double));
            SMASH_inputfile.read(
                reinterpret_cast<char *>(&pdg), sizeof(std::int32_t));
            SMASH_inputfile.read(
                reinterpret_cast<char *>(&id), sizeof(std::int32_t));
            SMASH_inputfile.read(
                reinterpret_cast<char *>(&charge), sizeof(std::int32_t));
            SMASH_inputfile.read(
                reinterpret_cast<char *>(&ncoll), sizeof(std::int32_t));
            SMASH_inputfile.read(
                reinterpret_cast<char *>(&form_time), sizeof(double));
            SMASH_inputfile.read(
                reinterpret_cast<char *>(&xsecfac), sizeof(double));
            SMASH_inputfile.read(
                reinterpret_cast<char *>(&proc_id_origin),
                sizeof(std::int32_t));
            SMASH_inputfile.read(
                reinterpret_cast<char *>(&proc_type_origin),
                sizeof(std::int32_t));
            SMASH_inputfile.read(
                reinterpret_cast<char *>(&time_last_coll), sizeof(double));
            SMASH_inputfile.read(
                reinterpret_cast<char *>(&pdg_mother1), sizeof(std::int32_t));
            SMASH_inputfile.read(
                reinterpret_cast<char *>(&pdg_mother2), sizeof(std::int32_t));

            double origin_t = time_last_coll;
            double vx = px / p0, vy = py / p0, vz = pz / p0;
            double dt = t - origin_t;
            double origin_x = x - vx * dt, origin_y = y - vy * dt,
                   origin_z = z - vz * dt;

            particle_info temp_particle_info;
            temp_particle_info.monval = pdg;
            temp_particle_info.mass = m;
            temp_particle_info.t = origin_t;
            temp_particle_info.x = origin_x;
            temp_particle_info.y = origin_y;
            temp_particle_info.z = origin_z;
            temp_particle_info.E = p0;
            temp_particle_info.px = px;
            temp_particle_info.py = py;
            temp_particle_info.pz = pz;

            (*resulting_particle_list)[ievent]->push_back(temp_particle_info);
        }
        num_particles += n_part_lines;
        // std::cout << "Read in " << n_part_lines << " particles" << std::endl;
        ievent++;
    }
    return 0;
}